

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_pkt.cc
# Opt level: O0

int bssl::tls_write_app_data
              (SSL *ssl,bool *out_needs_handshake,size_t *out_bytes_written,
              Span<const_unsigned_char> in)

{
  ushort uVar1;
  SSL_PROTOCOL_METHOD *pSVar2;
  bool *this;
  bool bVar3;
  int iVar4;
  pointer this_00;
  undefined1 *puVar5;
  pointer pSVar6;
  pointer psVar7;
  unsigned_long *puVar8;
  size_t in_R9;
  Span<const_unsigned_char> SVar9;
  Span<const_unsigned_char> SVar10;
  byte local_b1;
  SSL *local_b0;
  uchar *local_a8;
  uchar *local_98;
  undefined1 auStack_88 [4];
  int ret;
  size_t bytes_written;
  SSL_PROTOCOL_METHOD *local_78;
  size_t to_write;
  __uniq_ptr_impl<bio_st,_bssl::internal::Deleter> local_68;
  SSL_HANDSHAKE *hs;
  size_t max_send_fragment;
  undefined1 auStack_50 [7];
  bool is_early_data_write;
  _func_void_int_int_int_void_ptr_size_t_SSL_ptr_void_ptr *local_48;
  bool *local_40;
  size_t total_bytes_written;
  size_t *out_bytes_written_local;
  bool *out_needs_handshake_local;
  SSL *ssl_local;
  Span<const_unsigned_char> in_local;
  
  in_local.data_ = (uchar *)in.size_;
  ssl_local = (SSL *)in.data_;
  total_bytes_written = (size_t)out_bytes_written;
  out_bytes_written_local = (size_t *)out_needs_handshake;
  out_needs_handshake_local = (bool *)ssl;
  bVar3 = ssl_can_write(ssl);
  if (!bVar3) {
    __assert_fail("ssl_can_write(ssl)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_pkt.cc"
                  ,0x28,"int bssl::tls_write_app_data(SSL *, bool *, size_t *, Span<const uint8_t>)"
                 );
  }
  this_00 = std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator->
                      ((unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> *)
                       (*(long *)(out_needs_handshake_local + 0x30) + 0x110));
  bVar3 = SSLAEADContext::is_null_cipher(this_00);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    __assert_fail("!ssl->s3->aead_write_ctx->is_null_cipher()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_pkt.cc"
                  ,0x29,"int bssl::tls_write_app_data(SSL *, bool *, size_t *, Span<const uint8_t>)"
                 );
  }
  *(undefined1 *)out_bytes_written_local = 0;
  if (*(int *)(*(long *)(out_needs_handshake_local + 0x30) + 0xb0) == 0) {
    local_40 = *(bool **)(*(long *)(out_needs_handshake_local + 0x30) + 0x90);
    puVar5 = (undefined1 *)Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&ssl_local);
    if (puVar5 < local_40) {
      ERR_put_error(0x10,0,0x6f,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_pkt.cc"
                    ,0x3a);
      in_local.size_._4_4_ = -1;
    }
    else {
      _auStack_50 = Span<const_unsigned_char>::subspan
                              ((Span<const_unsigned_char> *)&ssl_local,(size_t)local_40,
                               0xffffffffffffffff);
      ssl_local = (SSL *)_auStack_50;
      in_local.data_ = (uchar *)local_48;
      local_b1 = 0;
      if ((out_needs_handshake_local[0xa4] & 1U) == 0) {
        iVar4 = SSL_in_early_data((SSL *)out_needs_handshake_local);
        local_b1 = 0;
        if (iVar4 != 0) {
          pSVar6 = std::unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::operator->
                             ((unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter> *)
                              (*(long *)(out_needs_handshake_local + 0x30) + 0x118));
          local_b1 = (byte)(*(uint *)&pSVar6->field_0x6c8 >> 0xd) & 1;
        }
      }
      max_send_fragment._7_1_ = local_b1;
      do {
        hs = (SSL_HANDSHAKE *)(ulong)*(ushort *)(out_needs_handshake_local + 0x10);
        if ((max_send_fragment._7_1_ & 1) != 0) {
          local_68._M_t.super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_bio_st_*,_false>._M_head_impl =
               (tuple<bio_st_*,_bssl::internal::Deleter>)
               std::unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::get
                         ((unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter> *)
                          (*(long *)(out_needs_handshake_local + 0x30) + 0x118));
          uVar1 = *(uint16_t *)
                   ((long)local_68._M_t.super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_bio_st_*,_false>._M_head_impl + 0x6d0);
          psVar7 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                             ((UniquePtr<SSL_SESSION> *)
                              ((long)local_68._M_t.
                                     super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_bio_st_*,_false>._M_head_impl + 0x690));
          if (psVar7->ticket_max_early_data <= (uint)uVar1) {
            *(bool **)(*(long *)(out_needs_handshake_local + 0x30) + 0x90) = local_40;
            *(uint *)((long)local_68._M_t.super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_bio_st_*,_false>._M_head_impl + 0x6c8) =
                 *(uint *)((long)local_68._M_t.
                                 super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bio_st_*,_false>._M_head_impl + 0x6c8) &
                 0xffffdfff;
            *(undefined1 *)out_bytes_written_local = 1;
            return -1;
          }
          psVar7 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                             ((UniquePtr<SSL_SESSION> *)
                              ((long)local_68._M_t.
                                     super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_bio_st_*,_false>._M_head_impl + 0x690));
          to_write = (size_t)(psVar7->ticket_max_early_data -
                             (uint)*(uint16_t *)
                                    ((long)local_68._M_t.
                                           super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_bio_st_*,_false>._M_head_impl +
                                    0x6d0));
          puVar8 = std::min<unsigned_long>((unsigned_long *)&hs,&to_write);
          hs = (SSL_HANDSHAKE *)*puVar8;
        }
        bytes_written = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&ssl_local);
        puVar8 = std::min<unsigned_long>((unsigned_long *)&hs,&bytes_written);
        this = out_needs_handshake_local;
        local_78 = (SSL_PROTOCOL_METHOD *)*puVar8;
        SVar9 = Span<const_unsigned_char>::subspan
                          ((Span<const_unsigned_char> *)&ssl_local,0,(size_t)local_78);
        local_98 = (uchar *)SVar9.size_;
        SVar10.size_ = in_R9;
        SVar10.data_ = local_98;
        iVar4 = do_tls_write((bssl *)this,(SSL *)auStack_88,(size_t *)0x17,(uint8_t)SVar9.data_,
                             SVar10);
        if (iVar4 < 1) {
          *(bool **)(*(long *)(out_needs_handshake_local + 0x30) + 0x90) = local_40;
          return iVar4;
        }
        if (local_78 < _auStack_88) {
          __assert_fail("bytes_written <= to_write",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_pkt.cc"
                        ,0x5c,
                        "int bssl::tls_write_app_data(SSL *, bool *, size_t *, Span<const uint8_t>)"
                       );
        }
        local_40 = &_auStack_88->is_dtls + (long)local_40;
        SVar10 = Span<const_unsigned_char>::subspan
                           ((Span<const_unsigned_char> *)&ssl_local,(size_t)_auStack_88,
                            0xffffffffffffffff);
        pSVar2 = _auStack_88;
        local_b0 = (SSL *)SVar10.data_;
        ssl_local = local_b0;
        local_a8 = (uchar *)SVar10.size_;
        in_local.data_ = local_a8;
        if ((max_send_fragment._7_1_ & 1) != 0) {
          pSVar6 = std::unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::operator->
                             ((unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter> *)
                              (*(long *)(out_needs_handshake_local + 0x30) + 0x118));
          pSVar6->early_data_written = pSVar6->early_data_written + (short)pSVar2;
        }
        bVar3 = Span<const_unsigned_char>::empty((Span<const_unsigned_char> *)&ssl_local);
      } while ((!bVar3) && ((*(uint *)(out_needs_handshake_local + 0x84) & 1) == 0));
      *(undefined8 *)(*(long *)(out_needs_handshake_local + 0x30) + 0x90) = 0;
      *(bool **)total_bytes_written = local_40;
      in_local.size_._4_4_ = 1;
    }
  }
  else {
    ERR_put_error(0x10,0,0xc2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_pkt.cc"
                  ,0x2e);
    in_local.size_._4_4_ = -1;
  }
  return in_local.size_._4_4_;
}

Assistant:

int tls_write_app_data(SSL *ssl, bool *out_needs_handshake,
                       size_t *out_bytes_written, Span<const uint8_t> in) {
  assert(ssl_can_write(ssl));
  assert(!ssl->s3->aead_write_ctx->is_null_cipher());

  *out_needs_handshake = false;

  if (ssl->s3->write_shutdown != ssl_shutdown_none) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_PROTOCOL_IS_SHUTDOWN);
    return -1;
  }

  size_t total_bytes_written = ssl->s3->unreported_bytes_written;
  if (in.size() < total_bytes_written) {
    // This can happen if the caller disables |SSL_MODE_ENABLE_PARTIAL_WRITE|,
    // asks us to write some input of length N, we successfully encrypt M bytes
    // and write it, but fail to write the rest. We will report
    // |SSL_ERROR_WANT_WRITE|. If the caller then retries with fewer than M
    // bytes, we cannot satisfy that request. The caller is required to always
    // retry with at least as many bytes as the previous attempt.
    OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_LENGTH);
    return -1;
  }

  in = in.subspan(total_bytes_written);

  const bool is_early_data_write =
      !ssl->server && SSL_in_early_data(ssl) && ssl->s3->hs->can_early_write;
  for (;;) {
    size_t max_send_fragment = ssl->max_send_fragment;
    if (is_early_data_write) {
      SSL_HANDSHAKE *hs = ssl->s3->hs.get();
      if (hs->early_data_written >= hs->early_session->ticket_max_early_data) {
        ssl->s3->unreported_bytes_written = total_bytes_written;
        hs->can_early_write = false;
        *out_needs_handshake = true;
        return -1;
      }
      max_send_fragment = std::min(
          max_send_fragment, size_t{hs->early_session->ticket_max_early_data -
                                    hs->early_data_written});
    }

    const size_t to_write = std::min(max_send_fragment, in.size());
    size_t bytes_written;
    int ret = do_tls_write(ssl, &bytes_written, SSL3_RT_APPLICATION_DATA,
                           in.subspan(0, to_write));
    if (ret <= 0) {
      ssl->s3->unreported_bytes_written = total_bytes_written;
      return ret;
    }

    // Note |bytes_written| may be less than |to_write| if there was a pending
    // record from a smaller write attempt.
    assert(bytes_written <= to_write);
    total_bytes_written += bytes_written;
    in = in.subspan(bytes_written);
    if (is_early_data_write) {
      ssl->s3->hs->early_data_written += bytes_written;
    }

    if (in.empty() || (ssl->mode & SSL_MODE_ENABLE_PARTIAL_WRITE)) {
      ssl->s3->unreported_bytes_written = 0;
      *out_bytes_written = total_bytes_written;
      return 1;
    }
  }
}